

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureExtractor::ArrayFeatureExtractor
          (ArrayFeatureExtractor *this,ArrayFeatureExtractor *from)

{
  ArrayFeatureExtractor *from_local;
  ArrayFeatureExtractor *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ArrayFeatureExtractor_006fb7e0;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->extractindex_,&from->extractindex_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

ArrayFeatureExtractor::ArrayFeatureExtractor(const ArrayFeatureExtractor& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      extractindex_(from.extractindex_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ArrayFeatureExtractor)
}